

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O3

matrix4d * tinyusdz::to_matrix(matrix4d *__return_storage_ptr__,quatf *q)

{
  undefined8 uVar1;
  double dVar2;
  long lVar3;
  double3x3 m33;
  double local_78;
  double dStack_70;
  double local_68;
  double local_60;
  double dStack_58;
  double local_50;
  double local_48;
  double dStack_40;
  double local_38;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  uVar1 = *(undefined8 *)(q->imag)._M_elems;
  dVar2 = (double)(float)((ulong)uVar1 >> 0x20);
  local_28._8_4_ = SUB84(dVar2,0);
  local_28._0_8_ = (double)(float)uVar1;
  local_28._12_4_ = (int)((ulong)dVar2 >> 0x20);
  uVar1 = *(undefined8 *)((q->imag)._M_elems + 2);
  dVar2 = (double)(float)((ulong)uVar1 >> 0x20);
  local_18._8_4_ = SUB84(dVar2,0);
  local_18._0_8_ = (double)(float)uVar1;
  local_18._12_4_ = (int)((ulong)dVar2 >> 0x20);
  linalg::qmat<double>((vec<double,_4> *)local_28);
  __return_storage_ptr__->m[3][1] = 0.0;
  __return_storage_ptr__->m[3][2] = 0.0;
  __return_storage_ptr__->m[2][3] = 0.0;
  __return_storage_ptr__->m[3][0] = 0.0;
  __return_storage_ptr__->m[2][1] = 0.0;
  __return_storage_ptr__->m[2][2] = 0.0;
  __return_storage_ptr__->m[1][3] = 0.0;
  __return_storage_ptr__->m[2][0] = 0.0;
  __return_storage_ptr__->m[1][1] = 0.0;
  __return_storage_ptr__->m[1][2] = 0.0;
  __return_storage_ptr__->m[0][3] = 0.0;
  __return_storage_ptr__->m[1][0] = 0.0;
  __return_storage_ptr__->m[3][3] = 0.0;
  lVar3 = 0;
  do {
    *(undefined8 *)((long)__return_storage_ptr__->m[0] + lVar3) = 0x3ff0000000000000;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0xa0);
  __return_storage_ptr__->m[0][0] = local_78;
  __return_storage_ptr__->m[0][1] = dStack_70;
  __return_storage_ptr__->m[0][2] = local_68;
  __return_storage_ptr__->m[1][0] = local_60;
  __return_storage_ptr__->m[1][1] = dStack_58;
  __return_storage_ptr__->m[1][2] = local_50;
  __return_storage_ptr__->m[2][0] = local_48;
  __return_storage_ptr__->m[2][1] = dStack_40;
  __return_storage_ptr__->m[2][2] = local_38;
  return __return_storage_ptr__;
}

Assistant:

value::matrix4d to_matrix(const value::quatf &q) {
  double3x3 m33 = linalg::qmat<double>({double(q.imag[0]), double(q.imag[1]),
                                        double(q.imag[2]), double(q.real)});

  value::matrix4d m;
  Identity(&m);

  m.m[0][0] = m33[0][0];
  m.m[0][1] = m33[0][1];
  m.m[0][2] = m33[0][2];
  m.m[1][0] = m33[1][0];
  m.m[1][1] = m33[1][1];
  m.m[1][2] = m33[1][2];
  m.m[2][0] = m33[2][0];
  m.m[2][1] = m33[2][1];
  m.m[2][2] = m33[2][2];

  return m;
}